

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

void vkt::texture::util::calcCubemapFaceCoords
               (Vec3 *r,Vec3 *drdx,Vec3 *drdy,int faceNdx,Vec2 *coordFace,Vec2 *dPdxFace,
               Vec2 *dPdyFace)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float local_60 [4];
  float local_50 [4];
  float local_40 [4];
  Vec3 dPcdy;
  Vec3 dPcdx;
  Vec3 coordC;
  
  lVar7 = 0;
  local_40[2] = 0.0;
  local_40[0] = 0.0;
  local_40[1] = 0.0;
  local_50[2] = 0.0;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  do {
    iVar2 = *(int *)((long)calcCubemapFaceCoords::compMap[faceNdx] + lVar7);
    fVar9 = (float)*(int *)((long)calcCubemapFaceCoords::signMap[faceNdx] + lVar7);
    *(float *)((long)local_40 + lVar7) = r->m_data[iVar2] * fVar9;
    *(float *)((long)local_50 + lVar7) = drdx->m_data[iVar2] * fVar9;
    *(float *)((long)local_60 + lVar7) = fVar9 * drdy->m_data[iVar2];
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xc);
  fVar9 = -local_40[2];
  if (-local_40[2] <= local_40[2]) {
    fVar9 = local_40[2];
  }
  fVar10 = -fVar9;
  if (-fVar9 <= fVar9) {
    fVar10 = fVar9;
  }
  lVar7 = 0;
  pfVar5 = local_60;
  pfVar6 = local_50;
  pfVar8 = local_40;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    fVar1 = *pfVar8;
    coordFace->m_data[lVar7] = (fVar1 * 0.5) / fVar10 + 0.5;
    dPdxFace->m_data[lVar7] = ((*pfVar6 * fVar10 - local_50[2] * fVar1) * 0.5) / (fVar9 * fVar9);
    dPdyFace->m_data[lVar7] = ((*pfVar5 * fVar10 - fVar1 * local_60[2]) * 0.5) / (fVar9 * fVar9);
    lVar7 = 1;
    pfVar5 = local_60 + 1;
    pfVar6 = local_50 + 1;
    pfVar8 = local_40 + 1;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

void calcCubemapFaceCoords (const Vec3& r,
							const Vec3& drdx,
							const Vec3& drdy,
							const int	faceNdx,
							Vec2&		coordFace,
							Vec2&		dPdxFace,
							Vec2&		dPdyFace)
{
	DE_ASSERT(faceNdx >= 0 && faceNdx < 6);

	static const int compMap[6][3] =
	{
		{2, 1, 0},
		{2, 1, 0},
		{0, 2, 1},
		{0, 2, 1},
		{0, 1, 2},
		{0, 1, 2}
	};

	static const int signMap[6][3] =
	{
		{-1, -1, +1},
		{+1, -1, -1},
		{+1, +1, +1},
		{+1, -1, -1},
		{+1, -1, +1},
		{-1, -1, -1}
	};

	Vec3 coordC;
	Vec3 dPcdx;
	Vec3 dPcdy;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int	mappedComp = compMap[faceNdx][compNdx];
		const int	mappedSign = signMap[faceNdx][compNdx];

		coordC[compNdx] = r   [mappedComp]	* (float)mappedSign;
		dPcdx [compNdx]	= drdx[mappedComp]	* (float)mappedSign;
		dPcdy [compNdx]	= drdy[mappedComp]	* (float)mappedSign;
	}

	DE_ASSERT(coordC[2] != 0.0f);
	coordC[2] = de::abs(coordC[2]);

	for (int compNdx = 0; compNdx < 2; ++compNdx)
	{
		coordFace[compNdx] = 0.5f * coordC[compNdx] / de::abs(coordC[2]) + 0.5f;

		dPdxFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdx[compNdx] - coordC[compNdx] * dPcdx[2]) / (coordC[2] * coordC[2]);
		dPdyFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdy[compNdx] - coordC[compNdx] * dPcdy[2]) / (coordC[2] * coordC[2]);
	}
}